

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<float>::
     call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,float(*)(float),float_const&>
               (QPromiseResolve<float> *resolve,QPromiseReject<float> *reject,_func_float_float *fn,
               float *args)

{
  float local_2c;
  float *local_28;
  float *args_local;
  _func_float_float *fn_local;
  QPromiseReject<float> *reject_local;
  QPromiseResolve<float> *resolve_local;
  
  local_28 = args;
  args_local = (float *)fn;
  fn_local = (_func_float_float *)reject;
  reject_local = (QPromiseReject<float> *)resolve;
  local_2c = (*fn)(*args);
  PromiseFulfill<float>::
  call<float,QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
            (&local_2c,(QPromiseResolve<float> *)reject_local,(QPromiseReject<float> *)fn_local);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }